

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Own<capnp::ClientHook> __thiscall
capnp::QueuedPipeline::getPipelinedCap(QueuedPipeline *this,Array<capnp::PipelineOp> *ops)

{
  PipelineHook *pPVar1;
  Array<capnp::PipelineOp> *pAVar2;
  Promise<kj::Own<capnp::ClientHook>_> *params;
  Type *in_RCX;
  Array<capnp::PipelineOp> *in_RDX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar3;
  Own<capnp::ClientHook> OVar4;
  Own<capnp::QueuedClient> local_90 [2];
  undefined1 local_69;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>
  local_68;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>,_kj::Own<capnp::PipelineHook>_>
  clientPromise;
  Own<capnp::PipelineHook> *r;
  Array<capnp::PipelineOp> *ops_local;
  QueuedPipeline *this_local;
  
  clientPromise.super_PromiseBase.node.ptr =
       (PromiseNode *)
       kj::_::readMaybe<capnp::PipelineHook>
                 ((Maybe<kj::Own<capnp::PipelineHook>_> *)&ops[1].disposer);
  if ((Own<capnp::PipelineHook> *)clientPromise.super_PromiseBase.node.ptr ==
      (Own<capnp::PipelineHook> *)0x0) {
    kj::ForkedPromise<kj::Own<capnp::PipelineHook>_>::addBranch
              ((ForkedPromise<kj::Own<capnp::PipelineHook>_> *)local_48);
    kj::
    mvCapture<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::__0,kj::Array<capnp::PipelineOp>&>
              (&local_68,(kj *)in_RDX,(Array<capnp::PipelineOp> *)&local_69,in_RCX);
    kj::Promise<kj::Own<capnp::PipelineHook>>::
    then<kj::CaptureByMove<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::__0,kj::Array<capnp::PipelineOp>>,kj::_::PropagateException>
              ((Promise<kj::Own<capnp::PipelineHook>> *)local_38,
               (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>
                *)local_48,(PropagateException *)&local_68);
    kj::
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:411:9),_kj::Array<capnp::PipelineOp>_>
    ::~CaptureByMove(&local_68);
    kj::Promise<kj::Own<capnp::PipelineHook>_>::~Promise
              ((Promise<kj::Own<capnp::PipelineHook>_> *)local_48);
    params = kj::mv<kj::Promise<kj::Own<capnp::ClientHook>>>
                       ((Promise<kj::Own<capnp::ClientHook>_> *)local_38);
    kj::refcounted<capnp::QueuedClient,kj::Promise<kj::Own<capnp::ClientHook>>>
              ((kj *)local_90,params);
    kj::Own<capnp::ClientHook>::Own<capnp::QueuedClient,void>
              ((Own<capnp::ClientHook> *)this,local_90);
    kj::Own<capnp::QueuedClient>::~Own(local_90);
    kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise
              ((Promise<kj::Own<capnp::ClientHook>_> *)local_38);
    pCVar3 = extraout_RDX_00;
  }
  else {
    pPVar1 = kj::Own<capnp::PipelineHook>::get
                       ((Own<capnp::PipelineHook> *)clientPromise.super_PromiseBase.node.ptr);
    pAVar2 = kj::mv<kj::Array<capnp::PipelineOp>>(in_RDX);
    (*pPVar1->_vptr_PipelineHook[2])(this,pPVar1,pAVar2);
    pCVar3 = extraout_RDX;
  }
  OVar4.ptr = pCVar3;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

kj::Own<ClientHook> QueuedPipeline::getPipelinedCap(kj::Array<PipelineOp>&& ops) {
  KJ_IF_MAYBE(r, redirect) {
    return r->get()->getPipelinedCap(kj::mv(ops));
  } else {
    auto clientPromise = promise.addBranch().then(kj::mvCapture(ops,
        [](kj::Array<PipelineOp>&& ops, kj::Own<PipelineHook> pipeline) {
          return pipeline->getPipelinedCap(kj::mv(ops));
        }));

    return kj::refcounted<QueuedClient>(kj::mv(clientPromise));
  }